

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapePiram>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  int iVar1;
  pair<int,_long> *ppVar2;
  int d;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_40;
  
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (divphi,(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements,1);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (phi,3,(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(phi);
  TPZShapeH1<pzshape::TPZShapePiram>::Shape(pt,data);
  if (0 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements) {
    local_40 = 0;
    lVar5 = 0;
    do {
      ppVar2 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
      iVar1 = ppVar2[lVar5].first;
      lVar6 = (long)iVar1;
      lVar3 = ppVar2[lVar5].second;
      if (((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
         ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      divphi->fElem[lVar5] = 0.0;
      lVar4 = (long)(int)lVar3;
      lVar3 = 0;
      do {
        if (((lVar4 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar4)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow <= lVar3) || (iVar1 < 0)) ||
           ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)phi->fElem +
         lVar3 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_40) =
             (data->fPhi).super_TPZFMatrix<double>.fElem[lVar4] *
             (data->fMasterDirections).super_TPZFMatrix<double>.fElem
             [(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow * lVar6 + lVar3];
        if (((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar3) ||
           ((lVar4 < 0 ||
            ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
             <= lVar4)))) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
             super_TPZBaseMatrix.fRow <= lVar3) ||
           ((iVar1 < 0 ||
            ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
             super_TPZBaseMatrix.fCol <= lVar6)))) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        divphi->fElem[lVar5] =
             (data->fDPhi).super_TPZFMatrix<double>.fElem
             [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow * lVar4 + lVar3] *
             (data->fMasterDirections).super_TPZFMatrix<double>.fElem
             [(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow * lVar6 + lVar3] + divphi->fElem[lVar5];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar5 = lVar5 + 1;
      local_40 = local_40 + 8;
    } while (lVar5 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{
    
    divphi.Resize(data.fSDVecShapeIndex.size(),1);
    divphi.Zero();
    phi.Resize(TSHAPE::Dimension,data.fSDVecShapeIndex.size());
    phi.Zero();

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        auto it = data.fSDVecShapeIndex[i];
        int vecindex = it.first;
        int scalindex = it.second;
        divphi(i,0) = 0.;
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
            divphi(i,0) += data.fDPhi(d,scalindex)*data.fMasterDirections(d,vecindex);
        }
    }
}